

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O3

ProgramContext * __thiscall
deqp::gles3::Performance::ShaderCompilerLoopCase::generateShaderData
          (ProgramContext *__return_storage_ptr__,ShaderCompilerLoopCase *this,int measurementNdx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  float *pfVar3;
  float fVar4;
  float fVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  float *pfVar9;
  uint cacheAvoidanceID;
  float *pfVar10;
  int in_R9D;
  undefined8 uVar11;
  string *shaderSourceTemplate;
  float fVar12;
  Vector<float,_16> result;
  string nameSpec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  undefined1 local_178 [8];
  undefined8 uStack_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  float local_158 [10];
  int local_130;
  LoopType local_12c;
  undefined1 local_128 [8];
  undefined8 uStack_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  undefined8 local_108;
  undefined8 uStack_100;
  size_type local_f8;
  float afStack_f0 [2];
  float local_e8 [2];
  float afStack_e0 [2];
  float local_d8 [2];
  float afStack_d0 [6];
  float local_b8 [8];
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  local_98;
  string local_78;
  float local_58 [10];
  
  cacheAvoidanceID = (this->super_ShaderCompilerCase).m_startHash;
  if ((this->super_ShaderCompilerCase).m_avoidCache == true) {
    uVar6 = ((uint)measurementNdx >> 0x10 ^ measurementNdx ^ 0x3d) * 9;
    uVar6 = (uVar6 >> 4 ^ uVar6) * 0x27d4eb2d;
    cacheAvoidanceID = cacheAvoidanceID ^ uVar6 ^ uVar6 >> 0xf;
  }
  getNameSpecialization_abi_cxx11_(&local_78,(Performance *)(ulong)cacheAvoidanceID,measurementNdx);
  (__return_storage_ptr__->vertShaderSource)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->vertShaderSource).field_2;
  (__return_storage_ptr__->vertShaderSource)._M_string_length = 0;
  (__return_storage_ptr__->vertShaderSource).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->fragShaderSource)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->fragShaderSource).field_2;
  (__return_storage_ptr__->fragShaderSource)._M_string_length = 0;
  (__return_storage_ptr__->fragShaderSource).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  loopVertexTemplate_abi_cxx11_
            ((string *)local_178,(Performance *)(ulong)this->m_type,(uint)this->m_isVertexCase,
             SUB41(this->m_numLoopIterations,0),this->m_nestingDepth,in_R9D);
  specializeShaderSource
            ((string *)local_128,(string *)local_178,cacheAvoidanceID,SHADER_VALIDITY_VALID);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_128);
  if (local_128 != (undefined1  [8])&local_118) {
    operator_delete((void *)local_128,local_118._M_allocated_capacity + 1);
  }
  if (local_178 != (undefined1  [8])(local_178 + 0x10)) {
    operator_delete((void *)local_178,local_168._M_allocated_capacity + 1);
  }
  loopFragmentTemplate_abi_cxx11_
            ((string *)local_178,(Performance *)(ulong)this->m_type,(uint)this->m_isVertexCase,
             SUB41(this->m_numLoopIterations,0),this->m_nestingDepth,in_R9D);
  shaderSourceTemplate = (string *)local_178;
  specializeShaderSource
            ((string *)local_128,shaderSourceTemplate,cacheAvoidanceID,SHADER_VALIDITY_VALID);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->fragShaderSource,(string *)local_128);
  if (local_128 != (undefined1  [8])&local_118) {
    operator_delete((void *)local_128,local_118._M_allocated_capacity + 1);
  }
  if (local_178 != (undefined1  [8])(local_178 + 0x10)) {
    operator_delete((void *)local_178,local_168._M_allocated_capacity + 1);
  }
  local_130 = this->m_numLoopIterations;
  local_12c = this->m_type;
  local_98.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::operator+(&local_198,"a_position",&local_78);
  local_58[4] = -1.0;
  local_58[5] = -1.0;
  local_58[6] = 0.0;
  local_58[7] = 1.0;
  local_58[0] = -1.0;
  local_58[1] = 1.0;
  local_58[2] = 0.0;
  local_58[3] = 1.0;
  pfVar3 = local_b8 + 4;
  local_b8[4] = 1.0;
  local_b8[5] = -1.0;
  local_b8[6] = 0.0;
  local_b8[7] = 1.0;
  local_b8[0] = 1.0;
  local_b8[1] = 1.0;
  local_b8[2] = 0.0;
  local_b8[3] = 1.0;
  local_178 = (undefined1  [8])0x0;
  uStack_170 = 0;
  local_168._M_allocated_capacity = 0;
  local_168._8_8_ = 0;
  local_158[0] = 0.0;
  local_158[1] = 0.0;
  local_158[2] = 0.0;
  local_158[3] = 0.0;
  local_158[4] = 0.0;
  local_158[5] = 0.0;
  local_158[6] = 0.0;
  local_158[7] = 0.0;
  lVar8 = 0;
  do {
    iVar7 = (int)lVar8;
    pfVar9 = local_58 + 4;
    if (((iVar7 != 0) && (pfVar9 = local_58, iVar7 != 1)) && (pfVar9 = local_b8, iVar7 == 2)) {
      pfVar9 = pfVar3;
    }
    fVar12 = pfVar9[1];
    fVar4 = pfVar9[2];
    fVar5 = pfVar9[3];
    *(float *)&(shaderSourceTemplate->_M_dataplus)._M_p = *pfVar9;
    *(float *)((long)&(shaderSourceTemplate->_M_dataplus)._M_p + 4) = fVar12;
    *(float *)&shaderSourceTemplate->_M_string_length = fVar4;
    *(float *)((long)&shaderSourceTemplate->_M_string_length + 4) = fVar5;
    lVar8 = lVar8 + 1;
    shaderSourceTemplate = (string *)&shaderSourceTemplate->field_2;
  } while (lVar8 != 4);
  local_128 = (undefined1  [8])&local_118;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_128,local_198._M_dataplus._M_p,
             local_198._M_dataplus._M_p + local_198._M_string_length);
  local_d8[0] = local_158[4];
  local_d8[1] = local_158[5];
  afStack_d0[0] = local_158[6];
  afStack_d0[1] = local_158[7];
  local_e8[0] = local_158[0];
  local_e8[1] = local_158[1];
  afStack_e0[0] = local_158[2];
  afStack_e0[1] = local_158[3];
  local_f8 = local_168._M_allocated_capacity;
  afStack_f0[0] = (float)local_168._8_4_;
  afStack_f0[1] = (float)local_168._12_4_;
  local_108 = (pointer)local_178;
  uStack_100 = uStack_170;
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ::emplace_back<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>
            (&local_98,(AttribSpec *)local_128);
  if (local_128 != (undefined1  [8])&local_118) {
    operator_delete((void *)local_128,local_118._M_allocated_capacity + 1);
  }
  paVar1 = &local_198.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar1) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_198,"a_value",&local_78);
  local_58[4] = 1.0;
  local_58[5] = 1.0;
  local_58[6] = 1.0;
  local_58[7] = 1.0;
  local_58[0] = 1.0;
  local_58[1] = 1.0;
  local_58[2] = 1.0;
  local_58[3] = 1.0;
  local_b8[4] = 1.0;
  local_b8[5] = 1.0;
  local_b8[6] = 1.0;
  local_b8[7] = 1.0;
  local_b8[0] = 1.0;
  local_b8[1] = 1.0;
  local_b8[2] = 1.0;
  local_b8[3] = 1.0;
  pfVar9 = (float *)local_178;
  local_178 = (undefined1  [8])0x0;
  uStack_170 = 0;
  local_168._M_allocated_capacity = 0;
  local_168._8_8_ = 0;
  local_158[0] = 0.0;
  local_158[1] = 0.0;
  local_158[2] = 0.0;
  local_158[3] = 0.0;
  local_158[4] = 0.0;
  local_158[5] = 0.0;
  local_158[6] = 0.0;
  local_158[7] = 0.0;
  lVar8 = 0;
  do {
    iVar7 = (int)lVar8;
    pfVar10 = local_58 + 4;
    if (((iVar7 != 0) && (pfVar10 = local_58, iVar7 != 1)) && (pfVar10 = local_b8, iVar7 == 2)) {
      pfVar10 = pfVar3;
    }
    fVar12 = pfVar10[1];
    fVar4 = pfVar10[2];
    fVar5 = pfVar10[3];
    *pfVar9 = *pfVar10;
    pfVar9[1] = fVar12;
    pfVar9[2] = fVar4;
    pfVar9[3] = fVar5;
    lVar8 = lVar8 + 1;
    pfVar9 = pfVar9 + 4;
  } while (lVar8 != 4);
  local_128 = (undefined1  [8])&local_118;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_128,local_198._M_dataplus._M_p,
             local_198._M_dataplus._M_p + local_198._M_string_length);
  local_d8[0] = local_158[4];
  local_d8[1] = local_158[5];
  afStack_d0[0] = local_158[6];
  afStack_d0[1] = local_158[7];
  local_e8[0] = local_158[0];
  local_e8[1] = local_158[1];
  afStack_e0[0] = local_158[2];
  afStack_e0[1] = local_158[3];
  local_f8 = local_168._M_allocated_capacity;
  afStack_f0[0] = (float)local_168._8_4_;
  afStack_f0[1] = (float)local_168._12_4_;
  local_108 = (pointer)local_178;
  uStack_100 = uStack_170;
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ::emplace_back<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>
            (&local_98,(AttribSpec *)local_128);
  if (local_128 != (undefined1  [8])&local_118) {
    operator_delete((void *)local_128,local_118._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar1) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if (local_12c == LOOP_TYPE_DYNAMIC) {
    std::operator+(&local_198,"a_loopBound",&local_78);
    local_58[4] = (float)local_130;
    lVar8 = 0;
    local_58[5] = 0.0;
    local_58[6] = 0.0;
    local_58[7] = 0.0;
    local_58[0] = local_58[4];
    local_58[1] = 0.0;
    local_58[2] = 0.0;
    local_58[3] = 0.0;
    local_b8[4] = local_58[4];
    local_b8[5] = 0.0;
    local_b8[6] = 0.0;
    local_b8[7] = 0.0;
    local_b8[0] = local_58[4];
    local_b8[1] = 0.0;
    local_b8[2] = 0.0;
    local_b8[3] = 0.0;
    pfVar9 = (float *)local_178;
    local_178 = (undefined1  [8])0x0;
    uStack_170 = 0;
    local_168._M_allocated_capacity = 0;
    local_168._8_8_ = 0;
    local_158[0] = 0.0;
    local_158[1] = 0.0;
    local_158[2] = 0.0;
    local_158[3] = 0.0;
    local_158[4] = 0.0;
    local_158[5] = 0.0;
    local_158[6] = 0.0;
    local_158[7] = 0.0;
    do {
      iVar7 = (int)lVar8;
      pfVar10 = local_58 + 4;
      if (((iVar7 != 0) && (pfVar10 = local_58, iVar7 != 1)) && (pfVar10 = local_b8, iVar7 == 2)) {
        pfVar10 = pfVar3;
      }
      fVar12 = pfVar10[1];
      fVar4 = pfVar10[2];
      fVar5 = pfVar10[3];
      *pfVar9 = *pfVar10;
      pfVar9[1] = fVar12;
      pfVar9[2] = fVar4;
      pfVar9[3] = fVar5;
      lVar8 = lVar8 + 1;
      pfVar9 = pfVar9 + 4;
    } while (lVar8 != 4);
    local_128 = (undefined1  [8])&local_118;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_128,local_198._M_dataplus._M_p,
               local_198._M_dataplus._M_p + local_198._M_string_length);
    local_d8[0] = local_158[4];
    local_d8[1] = local_158[5];
    afStack_d0[0] = local_158[6];
    afStack_d0[1] = local_158[7];
    local_e8[0] = local_158[0];
    local_e8[1] = local_158[1];
    afStack_e0[0] = local_158[2];
    afStack_e0[1] = local_158[3];
    local_f8 = local_168._M_allocated_capacity;
    afStack_f0[0] = (float)local_168._8_4_;
    afStack_f0[1] = (float)local_168._12_4_;
    local_108 = (pointer)local_178;
    uStack_100 = uStack_170;
    std::
    vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
    ::emplace_back<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>
              (&local_98,(AttribSpec *)local_128);
    if (local_128 != (undefined1  [8])&local_118) {
      operator_delete((void *)local_128,local_118._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != paVar1) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    }
  }
  local_118._M_allocated_capacity =
       (size_type)
       (__return_storage_ptr__->vertexAttributes).
       super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_98.
       super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_128 = (undefined1  [8])
              (__return_storage_ptr__->vertexAttributes).
              super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
              ._M_impl.super__Vector_impl_data._M_start;
  uStack_120 = (pointer)(__return_storage_ptr__->vertexAttributes).
                        super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_98.
       super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_98.
       super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_98.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ::~vector((vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
             *)local_128);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ::~vector(&local_98);
  iVar7 = this->m_numLoopIterations;
  local_198.field_2._M_allocated_capacity = 0;
  local_198._M_dataplus._M_p._0_4_ = 0;
  local_198._M_dataplus._M_p._4_4_ = 0;
  local_198._M_string_length._0_4_ = 0;
  local_198._M_string_length._4_4_ = 0;
  local_198._M_dataplus._M_p = (pointer)0x0;
  local_198._M_string_length = 0;
  uVar11 = (pointer)0x0;
  if (this->m_type == LOOP_TYPE_UNIFORM) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
                   "u_loopBound",&local_78);
    local_128 = (undefined1  [8])&local_118;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_128,local_178,(pointer)((long)local_178 + uStack_170));
    fVar12 = (float)iVar7;
    local_108 = (pointer)((ulong)local_108 & 0xffffffff00000000);
    lVar8 = 9;
    do {
      lVar2 = lVar8 * 4;
      *(float *)(local_128 + lVar2) = fVar12;
      *(float *)(local_128 + lVar2 + 4) = fVar12;
      *(float *)((long)&uStack_120 + lVar2) = fVar12;
      *(float *)((long)&uStack_120 + lVar2 + 4) = fVar12;
      lVar8 = lVar8 + 4;
    } while (lVar8 != 0x19);
    std::
    vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
    ::emplace_back<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>
              ((vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
                *)&local_198,(UniformSpec *)local_128);
    if (local_128 != (undefined1  [8])&local_118) {
      operator_delete((void *)local_128,(ulong)(local_118._M_allocated_capacity + 1));
    }
    if (local_178 != (undefined1  [8])(local_178 + 0x10)) {
      operator_delete((void *)local_178,local_168._M_allocated_capacity + 1);
    }
    uVar11 = local_198.field_2._M_allocated_capacity;
  }
  local_118._M_allocated_capacity =
       (size_type)
       (__return_storage_ptr__->uniforms).
       super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)uVar11;
  local_128 = (undefined1  [8])
              (__return_storage_ptr__->uniforms).
              super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
              ._M_impl.super__Vector_impl_data._M_start;
  uStack_120 = (__return_storage_ptr__->uniforms).
               super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  *(undefined4 *)
   &(__return_storage_ptr__->uniforms).
    super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
    ._M_impl.super__Vector_impl_data._M_start = local_198._M_dataplus._M_p._0_4_;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->uniforms).
           super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = local_198._M_dataplus._M_p._4_4_;
  *(undefined4 *)
   &(__return_storage_ptr__->uniforms).
    super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
    ._M_impl.super__Vector_impl_data._M_finish = (undefined4)local_198._M_string_length;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->uniforms).
           super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = local_198._M_string_length._4_4_;
  local_198._M_dataplus._M_p = (pointer)0x0;
  local_198._M_string_length = 0;
  local_198.field_2._M_allocated_capacity = 0;
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ::~vector((vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
             *)local_128);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ::~vector((vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
             *)&local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

ShaderCompilerCase::ProgramContext ShaderCompilerLoopCase::generateShaderData (int measurementNdx) const
{
	deUint32		specID		= getSpecializationID(measurementNdx);
	string			nameSpec	= getNameSpecialization(specID);
	ProgramContext	result;

	result.vertShaderSource		= specializeShaderSource(loopVertexTemplate(m_type, m_isVertexCase, m_numLoopIterations, m_nestingDepth), specID, SHADER_VALIDITY_VALID);
	result.fragShaderSource		= specializeShaderSource(loopFragmentTemplate(m_type, m_isVertexCase, m_numLoopIterations, m_nestingDepth), specID, SHADER_VALIDITY_VALID);

	result.vertexAttributes		= loopShaderAttributes(nameSpec, m_type, m_numLoopIterations);
	result.uniforms				= loopShaderUniforms(nameSpec, m_type, m_numLoopIterations);

	return result;
}